

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::ParseAnyValue(Parser *this,Value *val,FieldDef *field)

{
  pointer pcVar1;
  pointer ppVar2;
  Offset<flatbuffers::String> t;
  uint t_00;
  ulonglong val_00;
  StructDef *struct_def;
  undefined8 extraout_RAX;
  string s;
  string local_60;
  string local_40;
  
  switch((val->type).base_type) {
  case BASE_TYPE_STRING:
    pcVar1 = (this->attribute_)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (this->attribute_)._M_string_length);
    Expect(this,1);
    t = FlatBufferBuilder::CreateString
                  (&this->builder_,local_60._M_dataplus._M_p,local_60._M_string_length);
    NumToString<unsigned_int>(&local_40,t.o);
    std::__cxx11::string::operator=((string *)&val->constant,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(BaseType)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_40._M_dataplus._M_p._4_4_,(BaseType)local_40._M_dataplus._M_p))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
    goto LAB_0010d003;
  case BASE_TYPE_VECTOR:
    Expect(this,0x5b);
    local_40._M_dataplus._M_p._0_4_ = (val->type).element;
    local_40._M_string_length = (size_type)(val->type).struct_def;
    local_40._M_dataplus._M_p._4_4_ = 0;
    local_40.field_2._M_allocated_capacity = 0;
    t_00 = ParseVector(this,(Type *)&local_40);
    goto LAB_0010cfd8;
  case BASE_TYPE_STRUCT:
    struct_def = (val->type).struct_def;
    break;
  case BASE_TYPE_UNION:
    if (field == (FieldDef *)0x0) {
LAB_0010d049:
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                    ,0x14e,"void flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *)");
    }
    ppVar2 = (this->field_stack_).
             super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ppVar2 == (this->field_stack_).
                   super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) ||
       (((ppVar2[-1].second)->value).type.base_type != BASE_TYPE_UTYPE)) {
      std::operator+(&local_60,"missing type field before this union value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
      Error(&local_60);
      goto LAB_0010d049;
    }
    val_00 = strtoull((this->field_stack_).
                      super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first.constant._M_dataplus._M_p
                      ,(char **)0x0,10);
    CheckBitsFit(val_00,8);
    struct_def = EnumDef::ReverseLookup((val->type).enum_def,(uint)val_00 & 0xff);
    if (struct_def == (StructDef *)0x0) {
      std::operator+(&local_60,"illegal type id for: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
      Error(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX);
    }
    break;
  default:
    ParseSingleValue(this,val);
    return;
  }
  t_00 = ParseTable(this,struct_def);
LAB_0010cfd8:
  NumToString<unsigned_int>(&local_60,t_00);
  std::__cxx11::string::operator=((string *)&val->constant,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
LAB_0010d003:
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Parser::ParseAnyValue(Value &val, FieldDef *field) {
  switch (val.type.base_type) {
    case BASE_TYPE_UNION: {
      assert(field);
      if (!field_stack_.size() ||
          field_stack_.back().second->value.type.base_type != BASE_TYPE_UTYPE)
        Error("missing type field before this union value: " + field->name);
      auto enum_idx = atot<unsigned char>(
                                    field_stack_.back().first.constant.c_str());
      auto struct_def = val.type.enum_def->ReverseLookup(enum_idx);
      if (!struct_def) Error("illegal type id for: " + field->name);
      val.constant = NumToString(ParseTable(*struct_def));
      break;
    }
    case BASE_TYPE_STRUCT:
      val.constant = NumToString(ParseTable(*val.type.struct_def));
      break;
    case BASE_TYPE_STRING: {
      auto s = attribute_;
      Expect(kTokenStringConstant);
      val.constant = NumToString(builder_.CreateString(s).o);
      break;
    }
    case BASE_TYPE_VECTOR: {
      Expect('[');
      val.constant = NumToString(ParseVector(val.type.VectorType()));
      break;
    }
    default:
      ParseSingleValue(val);
      break;
  }
}